

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestNestedMessageEnum::ByteSizeLong(TestNestedMessageEnum *this)

{
  uint uVar1;
  int size;
  RepeatedField<int> *value;
  size_t sVar2;
  uint32_t *puVar3;
  string *value_00;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestNestedMessageEnum *this_;
  TestNestedMessageEnum *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_direct_enum(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::EnumSize(value);
  size = _internal_direct_enum_size(this);
  sVar2 = google::protobuf::internal::FromIntSize(size);
  sStack_58 = sStack_58 + sVar2;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_redacted_string_abi_cxx11_(this);
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
      sStack_58 = sVar2 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestMessageEnum>((this->field_0)._impl_.nested_enum_);
      sStack_58 = sVar2 + 1 + sStack_58;
    }
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestNestedMessageEnum::ByteSizeLong() const {
  const TestNestedMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestNestedMessageEnum)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.MetaAnnotatedEnum direct_enum = 1;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_direct_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_direct_enum_size());
      total_size += data_size + tag_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // string redacted_string = 3 [debug_redact = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_redacted_string());
    }
    // .proto2_unittest.TestMessageEnum nested_enum = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.nested_enum_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}